

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-attr.cpp
# Opt level: O0

uint __thiscall yactfr::internal::TsdlAttr::align(TsdlAttr *this)

{
  TextLocation loc;
  bool bVar1;
  ostream *poVar2;
  TextLocation local_1d0;
  string local_1b8;
  ostringstream local_188 [8];
  ostringstream ss;
  TsdlAttr *this_local;
  
  checkKind(this,UInt);
  bVar1 = isPowOfTwo(this->uintVal);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    poVar2 = std::operator<<((ostream *)local_188,
                             "Invalid `align` attribute (must be a power of two): ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->uintVal);
    std::operator<<(poVar2,".");
    std::__cxx11::ostringstream::str();
    valTextLoc(&local_1d0,this);
    loc._lineNumber = local_1d0._lineNumber;
    loc._offset = local_1d0._offset;
    loc._colNumber = local_1d0._colNumber;
    throwTextParseError(&local_1b8,loc);
  }
  return (uint)this->uintVal;
}

Assistant:

unsigned int TsdlAttr::align() const
{
    this->checkKind(Kind::UInt);

    if (!isPowOfTwo(uintVal)) {
        std::ostringstream ss;

        ss << "Invalid `align` attribute (must be a power of two): " << uintVal << ".";
        throwTextParseError(ss.str(), this->valTextLoc());
    }

    return uintVal;
}